

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_merge_node_update(lyd_node *target,lyd_node *source)

{
  byte bVar1;
  LYS_NODE LVar2;
  LY_DATA_TYPE value_type;
  ly_ctx *ctx;
  lys_node *plVar3;
  int iVar4;
  hash_table *phVar5;
  lyd_node *plVar6;
  lyxml_elem *plVar7;
  
  LVar2 = target->schema->nodetype;
  if ((LVar2 & (LYS_ANYDATA|LYS_LEAF)) == LYS_UNKNOWN) {
    __assert_fail("target->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x9aa,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
  }
  ctx = target->schema->module->ctx;
  if (ctx == source->schema->module->ctx) {
    if (LVar2 != LYS_LEAF) {
      iVar4 = *(int *)&target->field_0x34;
      switch(iVar4) {
      case 0:
      case 2:
      case 4:
        lydict_remove(ctx,(char *)target->ht);
        break;
      case 1:
      case 3:
      case 5:
switchD_0016907f_caseD_1:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x9da,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
      case 6:
      case 7:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        break;
      case 8:
        lyxml_free_withsiblings(ctx,(lyxml_elem *)target->ht);
        break;
      case 0x10:
        lyd_free_withsiblings((lyd_node *)target->ht);
        break;
      default:
        if (iVar4 == 0x20) {
          free(target->ht);
        }
        else if (iVar4 == 0x21) goto switchD_0016907f_caseD_1;
      }
      *(undefined4 *)&target->field_0x34 = *(undefined4 *)&source->field_0x34;
      target->ht = source->ht;
      *(undefined4 *)&source->field_0x34 = 0x10;
      source->ht = (hash_table *)0x0;
      return;
    }
    lydict_remove(ctx,(char *)target->ht);
    phVar5 = (hash_table *)lydict_insert(ctx,(char *)source->ht,0);
    target->ht = phVar5;
    value_type = *(LY_DATA_TYPE *)&source[1].schema;
    *(LY_DATA_TYPE *)&target[1].schema = value_type;
    if (value_type == LY_TYPE_LEAFREF) {
      target->validity = target->validity | 8;
      lyp_parse_value((lys_type *)&target->schema[1].ref,(char **)&target->ht,(lyxml_elem *)0x0,
                      (lyd_node_leaf_list *)target,(lyd_attr *)0x0,(lys_module *)0x0,1,
                      (byte)source->field_0x9 & 1,0);
    }
    else {
      lyd_free_value((lyd_val)target->child,value_type,*(uint8_t *)((long)&target[1].schema + 4),
                     (lys_type *)&target->schema[1].ref,(char *)phVar5,(lyd_val *)0x0,
                     (LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
      target->child = source->child;
    }
    target->field_0x9 = target->field_0x9 & 0xfe | source->field_0x9 & 1;
    goto LAB_001691a7;
  }
  if (LVar2 != LYS_LEAF) {
    iVar4 = *(int *)&target->field_0x34;
    switch(iVar4) {
    case 0:
    case 2:
    case 4:
      lydict_remove(ctx,(char *)target->ht);
      break;
    case 1:
    case 3:
    case 5:
switchD_00169051_caseD_1:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0xa2b,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
    case 6:
    case 7:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      break;
    case 8:
      lyxml_free_withsiblings(ctx,(lyxml_elem *)target->ht);
      break;
    case 0x10:
      lyd_free_withsiblings((lyd_node *)target->ht);
      break;
    default:
      if (iVar4 == 0x20) {
        free(target->ht);
      }
      else if (iVar4 == 0x21) goto switchD_00169051_caseD_1;
    }
    iVar4 = *(int *)&source->field_0x34;
    *(int *)&target->field_0x34 = iVar4;
    plVar7 = (lyxml_elem *)source->ht;
    if (plVar7 == (lyxml_elem *)0x0) {
      return;
    }
    switch(iVar4) {
    case 0:
    case 2:
    case 4:
      plVar7 = (lyxml_elem *)lydict_insert(ctx,(char *)plVar7,0);
      break;
    case 1:
    case 3:
    case 5:
switchD_001691f0_caseD_1:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0xa4d,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
    case 6:
    case 7:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      goto switchD_001691f0_caseD_6;
    case 8:
      plVar7 = lyxml_dup_elem(ctx,plVar7,(lyxml_elem *)0x0,1,1);
      break;
    case 0x10:
      plVar7 = (lyxml_elem *)lyd_dup_withsiblings_to_ctx((lyd_node *)plVar7,1,ctx);
      break;
    default:
      if (iVar4 == 0x20) {
        iVar4 = lyd_lyb_data_length((char *)plVar7);
        if (iVar4 == -1) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
          return;
        }
        phVar5 = (hash_table *)malloc((long)iVar4);
        target->ht = phVar5;
        if (phVar5 != (hash_table *)0x0) {
          memcpy(phVar5,source->ht,(long)iVar4);
          return;
        }
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_merge_node_update");
        return;
      }
      if (iVar4 == 0x21) goto switchD_001691f0_caseD_1;
      goto switchD_001691f0_caseD_6;
    }
    target->ht = (hash_table *)plVar7;
switchD_001691f0_caseD_6:
    return;
  }
  lydict_remove(ctx,(char *)target->ht);
  phVar5 = (hash_table *)lydict_insert(ctx,(char *)source->ht,0);
  target->ht = phVar5;
  lyd_free_value((lyd_val)target->child,*(LY_DATA_TYPE *)&target[1].schema,
                 *(uint8_t *)((long)&target[1].schema + 4),(lys_type *)&target->schema[1].ref,
                 (char *)phVar5,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
  iVar4 = *(int *)&source[1].schema;
  *(int *)&target[1].schema = iVar4;
  bVar1 = source->field_0x9;
  target->field_0x9 = target->field_0x9 & 0xfe | bVar1 & 1;
  if (10 < iVar4 - 1U) {
switchD_00168fa4_caseD_3:
    plVar6 = source->child;
    goto LAB_001691a3;
  }
  switch(iVar4) {
  case 1:
  case 10:
    plVar6 = (lyd_node *)target->ht;
    break;
  default:
    plVar3 = target->schema;
    iVar4 = 1;
    goto LAB_0016917d;
  case 3:
  case 4:
  case 5:
    goto switchD_00168fa4_caseD_3;
  case 8:
    target->child = (lyd_node *)0x0;
    goto LAB_001691a7;
  case 9:
    target->validity = target->validity | 8;
    plVar3 = target->schema;
    iVar4 = 0;
LAB_0016917d:
    lyp_parse_value((lys_type *)&plVar3[1].ref,(char **)&target->ht,(lyxml_elem *)0x0,
                    (lyd_node_leaf_list *)target,(lyd_attr *)0x0,(lys_module *)0x0,1,bVar1 & 1,iVar4
                   );
    goto LAB_001691a7;
  case 0xb:
    plVar6 = (lyd_node *)lydict_insert(ctx,(char *)source->child,0);
  }
LAB_001691a3:
  target->child = plVar6;
LAB_001691a7:
  check_leaf_list_backlinks(target,2);
  return;
}

Assistant:

static void
lyd_merge_node_update(struct lyd_node *target, struct lyd_node *source)
{
    struct ly_ctx *ctx;
    struct lyd_node_leaf_list *trg_leaf, *src_leaf;
    struct lyd_node_anydata *trg_any, *src_any;
    int len;

    assert(target->schema->nodetype & (LYS_LEAF | LYS_ANYDATA));
    ctx = target->schema->module->ctx;

    if (ctx == source->schema->module->ctx) {
        /* source and targets are in the same context */
        if (target->schema->nodetype == LYS_LEAF) {
            trg_leaf = (struct lyd_node_leaf_list *)target;
            src_leaf = (struct lyd_node_leaf_list *)source;

            lydict_remove(ctx, trg_leaf->value_str);
            trg_leaf->value_str = lydict_insert(ctx, src_leaf->value_str, 0);
            trg_leaf->value_type = src_leaf->value_type;
            if (trg_leaf->value_type == LY_TYPE_LEAFREF) {
                trg_leaf->validity |= LYD_VAL_LEAFREF;
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str,
                                NULL, trg_leaf, NULL, NULL, 1, src_leaf->dflt, 0);
            } else {
                lyd_free_value(trg_leaf->value, trg_leaf->value_type, trg_leaf->value_flags,
                               &((struct lys_node_leaf *)trg_leaf->schema)->type, trg_leaf->value_str, NULL, NULL, NULL);
                trg_leaf->value = src_leaf->value;
            }
            trg_leaf->dflt = src_leaf->dflt;

            check_leaf_list_backlinks(target, 2);
        } else { /* ANYDATA */
            trg_any = (struct lyd_node_anydata *)target;
            src_any = (struct lyd_node_anydata *)source;

            switch(trg_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                lydict_remove(ctx, trg_any->value.str);
                break;
            case LYD_ANYDATA_DATATREE:
                lyd_free_withsiblings(trg_any->value.tree);
                break;
            case LYD_ANYDATA_XML:
                lyxml_free_withsiblings(ctx, trg_any->value.xml);
                break;
            case LYD_ANYDATA_LYB:
                free(trg_any->value.mem);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
            case LYD_ANYDATA_LYBD:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }

            trg_any->value_type = src_any->value_type;
            trg_any->value = src_any->value;

            src_any->value_type = LYD_ANYDATA_DATATREE;
            src_any->value.tree = NULL;
        }
    } else {
        /* we have different contexts for the target and source */
        if (target->schema->nodetype == LYS_LEAF) {
            trg_leaf = (struct lyd_node_leaf_list *)target;
            src_leaf = (struct lyd_node_leaf_list *)source;

            lydict_remove(ctx, trg_leaf->value_str);
            trg_leaf->value_str = lydict_insert(ctx, src_leaf->value_str, 0);
            lyd_free_value(trg_leaf->value, trg_leaf->value_type, trg_leaf->value_flags,
                           &((struct lys_node_leaf *)trg_leaf->schema)->type, trg_leaf->value_str, NULL, NULL, NULL);
            trg_leaf->value_type = src_leaf->value_type;
            trg_leaf->dflt = src_leaf->dflt;

            switch (trg_leaf->value_type) {
            case LY_TYPE_BINARY:
            case LY_TYPE_STRING:
                /* value_str pointer is shared in these cases */
                trg_leaf->value.string = trg_leaf->value_str;
                break;
            case LY_TYPE_LEAFREF:
                trg_leaf->validity |= LYD_VAL_LEAFREF;
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str,
                                NULL, trg_leaf, NULL, NULL, 1, trg_leaf->dflt, 0);
                break;
            case LY_TYPE_INST:
                trg_leaf->value.instance = NULL;
                break;
            case LY_TYPE_UNION:
                /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
                 * because of possible change of the value in case of instance-identifier) */
                trg_leaf->value.string = lydict_insert(ctx, src_leaf->value.string, 0);
                break;
            case LY_TYPE_BITS:
            case LY_TYPE_ENUM:
            case LY_TYPE_IDENT:
                /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
                 * a different context, searching for the type and duplicating the data is almost as same as resolving
                 * the string value, so due to a simplicity, parse the value for the duplicated leaf */
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str, NULL,
                                trg_leaf, NULL, NULL, 1, trg_leaf->dflt, 1);
                break;
            default:
                trg_leaf->value = src_leaf->value;
                break;
            }

            check_leaf_list_backlinks(target, 2);
        } else { /* ANYDATA */
            trg_any = (struct lyd_node_anydata *)target;
            src_any = (struct lyd_node_anydata *)source;

            switch(trg_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                lydict_remove(ctx, trg_any->value.str);
                break;
            case LYD_ANYDATA_DATATREE:
                lyd_free_withsiblings(trg_any->value.tree);
                break;
            case LYD_ANYDATA_XML:
                lyxml_free_withsiblings(ctx, trg_any->value.xml);
                break;
            case LYD_ANYDATA_LYB:
                free(trg_any->value.mem);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
            case LYD_ANYDATA_LYBD:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }

            trg_any->value_type = src_any->value_type;
            if ((void*)src_any->value.tree) {
                /* there is a value to duplicate */
                switch (trg_any->value_type) {
                case LYD_ANYDATA_CONSTSTRING:
                case LYD_ANYDATA_SXML:
                case LYD_ANYDATA_JSON:
                    trg_any->value.str = lydict_insert(ctx, src_any->value.str, 0);
                    break;
                case LYD_ANYDATA_DATATREE:
                    trg_any->value.tree = lyd_dup_withsiblings_to_ctx(src_any->value.tree, 1, ctx);
                    break;
                case LYD_ANYDATA_XML:
                    trg_any->value.xml = lyxml_dup_elem(ctx, src_any->value.xml, NULL, 1, 1);
                    break;
                case LYD_ANYDATA_LYB:
                    len = lyd_lyb_data_length(src_any->value.mem);
                    if (len == -1) {
                        LOGERR(ctx, LY_EINVAL, "Invalid LYB data.");
                        return;
                    }
                    trg_any->value.mem = malloc(len);
                    LY_CHECK_ERR_RETURN(!trg_any->value.mem, LOGMEM(ctx), );
                    memcpy(trg_any->value.mem, src_any->value.mem, len);
                    break;
                case LYD_ANYDATA_STRING:
                case LYD_ANYDATA_SXMLD:
                case LYD_ANYDATA_JSOND:
                case LYD_ANYDATA_LYBD:
                    /* dynamic strings are used only as input parameters */
                    assert(0);
                    break;
                }
            }
        }
    }
}